

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall Dfa::min_Dfa(Dfa *this)

{
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *this_00;
  pointer *pppFVar1;
  pointer *ppEVar2;
  _Rb_tree_header *p_Var3;
  int iVar4;
  _Rb_tree_color _Var5;
  ulong *puVar6;
  pointer ppFVar7;
  _Bit_type *p_Var8;
  pointer pEVar9;
  iterator iVar10;
  void *pvVar11;
  iterator __position;
  byte bVar12;
  Fa_Node *pFVar13;
  pointer psVar14;
  pointer piVar15;
  int iVar16;
  int iVar17;
  ulong *puVar18;
  pointer ppFVar19;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *this_01;
  _Rb_tree_node_base *p_Var20;
  _Rb_tree_node_base *p_Var21;
  Fa_Node *pFVar22;
  uint uVar23;
  long lVar24;
  uint uVar25;
  vector<bool,_std::allocator<bool>_> *__range1;
  ulong uVar26;
  pointer pEVar27;
  ulong uVar28;
  long lVar29;
  int iVar30;
  pointer ppFVar31;
  int iVar32;
  bool bVar33;
  bool bVar34;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *__range1_1;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> new_Node;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  new_node_set;
  vector<int,_std::allocator<int>_> belong;
  int j;
  set<Edge,_std::less<Edge>,_std::allocator<Edge>_> edge_tp;
  map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  mp;
  Node_num_edge to_tp;
  set<int,_std::less<int>,_std::allocator<int>_> node_tp;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> local_158;
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  local_138;
  vector<int,_std::allocator<int>_> local_120;
  Edge local_108;
  undefined1 local_f8 [8];
  _Rb_tree_node_base _Stack_f0;
  size_t local_d0;
  _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_c0;
  _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
  local_90;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  std::vector<bool,_std::allocator<bool>_>::resize(&this->used,(long)this->n + 1,false);
  puVar18 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
            ._M_start.super__Bit_iterator_base._M_p;
  puVar6 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p;
  uVar25 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset;
  if (uVar25 != 0 || puVar18 != puVar6) {
    uVar23 = 0;
    do {
      bVar12 = (byte)uVar23 & 0x3f;
      *puVar18 = *puVar18 & (-2L << bVar12 | 0xfffffffffffffffeU >> 0x40 - bVar12);
      bVar33 = uVar23 == 0x3f;
      puVar18 = puVar18 + bVar33;
      uVar23 = uVar23 + 1;
      if (bVar33) {
        uVar23 = 0;
      }
    } while (uVar23 != uVar25 || puVar18 != puVar6);
  }
  this_00 = &this->Node;
  ppFVar19 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  bVar33 = (bool)(ppFVar19[1]->temp ^ 1);
  ppFVar31 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppFVar7 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppFVar31 != ppFVar7) {
    do {
      iVar17 = (*ppFVar31)->n;
      uVar28 = (ulong)iVar17;
      iVar16 = iVar17 + 0x3f;
      if (-1 < (long)uVar28) {
        iVar16 = iVar17;
      }
      if (((this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar16 >> 6) +
            (ulong)((uVar28 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar28 & 0x3f) & 1) == 0) {
        dfs_del_unreachable_node(this,iVar17,bVar33);
      }
      ppFVar31 = ppFVar31 + 1;
    } while (ppFVar31 != ppFVar7);
    ppFVar19 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
               super__Vector_impl_data._M_start;
  }
  iVar17 = this->n;
  p_Var8 = (this->used).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p;
  uVar25 = iVar17 + 1;
  iVar16 = 0;
  do {
    iVar30 = iVar16;
    if (0 < iVar17) {
      uVar28 = 1;
      do {
        pFVar22 = ppFVar19[uVar28];
        iVar4 = pFVar22->n;
        uVar26 = (ulong)iVar4;
        iVar32 = iVar4 + 0x3f;
        if (-1 < (long)uVar26) {
          iVar32 = iVar4;
        }
        if (((p_Var8[(long)(iVar32 >> 6) +
                     (ulong)((uVar26 & 0x800000000000003f) < 0x8000000000000001) +
                     0xffffffffffffffff] >> (uVar26 & 0x3f) & 1) != 0) && (pFVar22->temp != bVar33))
        {
          if (pFVar22->end == false) {
            for (pEVar27 = (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pEVar27 !=
                *(pointer *)
                 ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8
                 ); pEVar27 = pEVar27 + 1) {
              if (pEVar27->v->temp == bVar33) goto LAB_00105320;
            }
          }
          else {
LAB_00105320:
            pFVar22->temp = bVar33;
            iVar30 = iVar30 + 1;
          }
        }
        uVar28 = uVar28 + 1;
      } while (uVar28 != uVar25);
    }
    bVar34 = iVar16 == iVar30;
    iVar16 = iVar30;
    if (bVar34) {
      std::vector<int,_std::allocator<int>_>::vector
                (&local_120,(long)(int)uVar25,(allocator_type *)&local_c0);
      if (0 < this->n) {
        ppFVar19 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                   super__Vector_impl_data._M_start;
        lVar24 = 0;
        do {
          pFVar22 = ppFVar19[lVar24 + 1];
          if (pFVar22->temp == bVar33) {
            if (pFVar22->end == true) {
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24 + 1] = 2;
            }
            else {
              local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar24 + 1] = 1;
            }
          }
          else {
            local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar24 + 1] = 0;
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < this->n);
      }
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::vector(&local_138,3,(allocator_type *)&local_c0);
      local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c0._M_impl._0_8_ = 0;
      std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*>
                ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)&local_158,(iterator)0x0,
                 (Fa_Node **)&local_c0);
      local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_c0._M_impl.super__Rb_tree_header._M_header;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_90._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_90._M_impl.super__Rb_tree_header._M_header;
      local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
      local_90._M_impl.super__Rb_tree_header._M_header._M_right =
           local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < this->n) {
        lVar24 = 0;
        do {
          pFVar22 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar24 + 1];
          if (pFVar22->temp == bVar33) {
            lVar29 = 0x60;
            if (pFVar22->end == false) {
              lVar29 = 0x30;
            }
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       (&((local_138.
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_t)._M_impl.field_0x0 +
                       lVar29),&pFVar22->n);
          }
          lVar24 = lVar24 + 1;
        } while (lVar24 < this->n);
      }
      iVar17 = 2;
      do {
        iVar16 = iVar17;
        iVar17 = iVar16;
        if (0 < iVar16) {
          uVar28 = 1;
          do {
            std::
            _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
            ::clear(&local_c0);
            psVar14 = local_138.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar28;
            p_Var20 = local_138.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[uVar28]._M_t._M_impl.
                      super__Rb_tree_header._M_header._M_left;
            p_Var21 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
            while (local_c0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var21,
                  (_Rb_tree_header *)p_Var20 != &(psVar14->_M_t)._M_impl.super__Rb_tree_header) {
              local_108._0_4_ = p_Var20[1]._M_color;
              std::
              _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
              ::clear(&local_90);
              pFVar22 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl
                        .super__Vector_impl_data._M_start[(int)local_108._0_4_];
              pEVar9 = *(pointer *)
                        ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl + 8);
              for (pEVar27 = (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl
                             .super__Vector_impl_data._M_start; pEVar27 != pEVar9;
                  pEVar27 = pEVar27 + 1) {
                if (pEVar27->v->temp == bVar33) {
                  local_f8[0] = pEVar27->c;
                  local_f8._4_4_ =
                       local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[pEVar27->v->n];
                  std::
                  _Rb_tree<std::pair<char,int>,std::pair<char,int>,std::_Identity<std::pair<char,int>>,std::less<std::pair<char,int>>,std::allocator<std::pair<char,int>>>
                  ::_M_insert_unique<std::pair<char,int>const&>
                            ((_Rb_tree<std::pair<char,int>,std::pair<char,int>,std::_Identity<std::pair<char,int>>,std::less<std::pair<char,int>>,std::allocator<std::pair<char,int>>>
                              *)&local_90,(pair<char,_int> *)local_f8);
                }
              }
              this_01 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                        std::
                        map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                        ::operator[]((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                      *)&local_c0,(key_type *)&local_90);
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>(this_01,(int *)&local_108);
              p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20);
              p_Var21 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
            }
            p_Var3 = &local_c0._M_impl.super__Rb_tree_header;
            if ((_Rb_tree_header *)p_Var21 != p_Var3) {
              bVar34 = true;
              do {
                if (bVar34) {
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::clear(&local_138.
                           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[uVar28]._M_t);
                  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                  ::operator=(&local_138.
                               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar28]._M_t,
                              (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                               *)&p_Var21[2]._M_left);
                }
                else {
                  std::
                  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ::push_back(&local_138,(value_type *)&p_Var21[2]._M_left);
                  iVar17 = iVar17 + 1;
                }
                p_Var21 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var21);
                bVar34 = false;
              } while ((_Rb_tree_header *)p_Var21 != p_Var3);
            }
            piVar15 = local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start;
            psVar14 = local_138.
                      super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar28 = uVar28 + 1;
          } while (uVar28 != iVar16 + 1);
          if (0 < iVar17) {
            uVar28 = 1;
            do {
              for (p_Var20 = psVar14[uVar28]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
                  (_Rb_tree_header *)p_Var20 != &psVar14[uVar28]._M_t._M_impl.super__Rb_tree_header;
                  p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
                piVar15[(int)p_Var20[1]._M_color] = (int)uVar28;
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 != iVar17 + 1);
          }
        }
      } while (iVar16 != iVar17);
      uVar25 = iVar16 + 1;
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::resize(&local_158,(long)(int)uVar25);
      if (0 < iVar16) {
        uVar28 = 1;
        do {
          pFVar22 = (Fa_Node *)operator_new(0x28);
          (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pFVar22->n = (int)uVar28;
          pFVar22->start = false;
          pFVar22->end = false;
          pFVar22->temp = false;
          local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_start[uVar28] = pFVar22;
          uVar28 = uVar28 + 1;
        } while (uVar25 != uVar28);
      }
      ppFVar19 = (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar19) {
        (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar19;
      }
      ppFVar19 = (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar19) {
        (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar19;
      }
      if (0 < iVar16) {
        uVar28 = 1;
        do {
          psVar14 = local_138.
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar28;
          for (p_Var20 = local_138.
                         super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar28]._M_t._M_impl.
                         super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var20 != &(psVar14->_M_t)._M_impl.super__Rb_tree_header;
              p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
            _Var5 = p_Var20[1]._M_color;
            iVar17 = local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[(int)_Var5];
            if ((this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)_Var5]->start == true) {
              pFVar22 = local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar17];
              pFVar22->start = true;
              iVar10._M_current =
                   (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
                          ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)this,iVar10,
                           local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar17);
              }
              else {
                *iVar10._M_current = pFVar22;
                pppFVar1 = &(this->begin).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppFVar1 = *pppFVar1 + 1;
              }
            }
            if ((this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                super__Vector_impl_data._M_start[(int)_Var5]->end == true) {
              pFVar22 = local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar17];
              pFVar22->end = true;
              iVar10._M_current =
                   (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar10._M_current ==
                  (this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<Fa_Node*,std::allocator<Fa_Node*>>::_M_realloc_insert<Fa_Node*const&>
                          ((vector<Fa_Node*,std::allocator<Fa_Node*>> *)&this->end,iVar10,
                           local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start + iVar17);
              }
              else {
                *iVar10._M_current = pFVar22;
                pppFVar1 = &(this->end).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish;
                *pppFVar1 = *pppFVar1 + 1;
              }
            }
            pFVar22 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[(int)_Var5];
            pEVar9 = *(pointer *)
                      ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                              _M_impl + 8);
            for (pEVar27 = (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                           super__Vector_impl_data._M_start; pEVar27 != pEVar9;
                pEVar27 = pEVar27 + 1) {
              local_f8[0] = pEVar27->c;
              local_f8._1_3_ = *(undefined3 *)&pEVar27->field_0x1;
              local_f8._4_4_ = *(undefined4 *)&pEVar27->field_0x4;
              _Stack_f0._0_8_ = pEVar27->v;
              if (((Fa_Node *)_Stack_f0._0_8_)->temp == bVar33) {
                std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                          ((vector<Edge,std::allocator<Edge>> *)
                           &local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                            _M_impl.super__Vector_impl_data._M_start[iVar17]->edge,
                           local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[((Fa_Node *)_Stack_f0._0_8_)->n],
                           local_f8);
              }
            }
          }
          uVar28 = uVar28 + 1;
        } while (uVar28 != uVar25);
      }
      if (0 < this->n) {
        lVar24 = 0;
        do {
          pFVar22 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar24 + 1];
          if ((pFVar22 != (Fa_Node *)0x0) &&
             (pvVar11 = (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                        super__Vector_impl_data._M_start, pvVar11 != (void *)0x0)) {
            operator_delete(pvVar11,(long)*(pointer *)
                                           ((long)&(pFVar22->edge).
                                                   super__Vector_base<Edge,_std::allocator<Edge>_>.
                                                   _M_impl + 0x10) - (long)pvVar11);
          }
          operator_delete(pFVar22,0x28);
          lVar24 = lVar24 + 1;
        } while (lVar24 < this->n);
      }
      ppFVar19 = (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if ((this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish != ppFVar19) {
        (this->Node).super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = ppFVar19;
      }
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator=(this_00,&local_158);
      this->n = iVar16;
      _Stack_f0._0_8_ = _Stack_f0._0_8_ & 0xffffffff00000000;
      _Stack_f0._M_parent = (_Base_ptr)0x0;
      local_d0 = 0;
      _Stack_f0._M_left = &_Stack_f0;
      _Stack_f0._M_right = &_Stack_f0;
      if (0 < iVar16) {
        lVar24 = 1;
        do {
          std::_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>::
          clear((_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>
                 *)local_f8);
          pFVar22 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                    super__Vector_impl_data._M_start[lVar24];
          pEVar27 = (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pEVar9 = *(pointer *)
                    ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl
                    + 8);
          p_Var20 = _Stack_f0._M_left;
          if (pEVar27 != pEVar9) {
            do {
              local_108.c = pEVar27->c;
              local_108._1_7_ = *(undefined7 *)&pEVar27->field_0x1;
              local_108.v = pEVar27->v;
              std::_Rb_tree<Edge,Edge,std::_Identity<Edge>,std::less<Edge>,std::allocator<Edge>>::
              _M_insert_unique<Edge_const&>
                        ((_Rb_tree<Edge,Edge,std::_Identity<Edge>,std::less<Edge>,std::allocator<Edge>>
                          *)local_f8,&local_108);
              pEVar27 = pEVar27 + 1;
            } while (pEVar27 != pEVar9);
            pFVar22 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar24];
            pEVar27 = (pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
                      super__Vector_impl_data._M_start;
            p_Var20 = _Stack_f0._M_left;
            if (*(pointer *)
                 ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8
                 ) != pEVar27) {
              *(pointer *)
               ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl + 8)
                   = pEVar27;
            }
          }
          for (; p_Var20 != &_Stack_f0;
              p_Var20 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var20)) {
            local_108._0_8_ = *(undefined8 *)(p_Var20 + 1);
            local_108.v = (Fa_Node *)p_Var20[1]._M_parent;
            pFVar22 = (this_00->super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[lVar24];
            __position._M_current =
                 *(pointer *)
                  ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl +
                  8);
            if (__position._M_current ==
                *(pointer *)
                 ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl +
                 0x10)) {
              std::vector<Edge,std::allocator<Edge>>::_M_realloc_insert<Edge_const&>
                        ((vector<Edge,std::allocator<Edge>> *)&pFVar22->edge,__position,&local_108);
            }
            else {
              pFVar13 = (Fa_Node *)p_Var20[1]._M_parent;
              *(undefined8 *)__position._M_current = *(undefined8 *)(p_Var20 + 1);
              (__position._M_current)->v = pFVar13;
              ppEVar2 = (pointer *)
                        ((long)&(pFVar22->edge).super__Vector_base<Edge,_std::allocator<Edge>_>.
                                _M_impl + 8);
              *ppEVar2 = *ppEVar2 + 1;
            }
          }
          bVar33 = lVar24 < this->n;
          lVar24 = lVar24 + 1;
        } while (bVar33);
      }
      std::_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>::
      ~_Rb_tree((_Rb_tree<Edge,_Edge,_std::_Identity<Edge>,_std::less<Edge>,_std::allocator<Edge>_>
                 *)local_f8);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_60);
      std::
      _Rb_tree<std::pair<char,_int>,_std::pair<char,_int>,_std::_Identity<std::pair<char,_int>_>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
      ::~_Rb_tree(&local_90);
      std::
      _Rb_tree<Node_num_edge,_std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(&local_c0);
      if (local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_158.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::~vector(&local_138);
      if (local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_120.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
  } while( true );
}

Assistant:

void Dfa::min_Dfa() {
    used.resize(n + 1);
    for (auto i:used) {
        i = false;
    }
    //delete useless node
    bool okflag = !Node[1]->temp;
    for (auto i:begin) {//delete unreachable nodes
        if (!used[i->n]) {
            dfs_del_unreachable_node(i->n, okflag);
        }
    }

    int last_tot, tot;
    for (last_tot = -1, tot = 0; last_tot != tot;) {//delete unterminated nodes
        last_tot = tot;
        for (int k = 1; k <= n; k++) {
            auto &i = Node[k];
            if (used[i->n]) {
                if (i->temp == okflag) {
                    continue;
                }
                if (i->end) {
                    i->temp = okflag;
                    tot++;
                    continue;
                }
                for (auto j:i->edge) {
                    if (j.v->temp == okflag) {
                        i->temp = okflag;
                        tot++;
                        break;
                    }
                }
            }
        }
    }

    vector<int> belong(n + 1);
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                belong[i] = 2;
            } else {
                belong[i] = 1;
            }
        } else {
            belong[i] = 0;
        }
    }

    vector<set<int>> new_node_set(3);
    vector<Fa_Node *> new_Node;

    new_Node.push_back(NULL);

    map<Node_num_edge, set<int>> mp;
    Node_num_edge to_tp;
    set<int> node_tp;
    //reach node set -> node set

    tot = 2;
    last_tot = 0;
    //end node set  and not end node set
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                new_node_set[2].insert(Node[i]->n);
            } else {
                new_node_set[1].insert(Node[i]->n);
            }
        }
    }

    while (last_tot != tot) {
        last_tot = tot;
        for (int i = 1; i <= last_tot; i++) {//all node set
            mp.clear();
            //node_tp.clear();
            for (auto j:new_node_set[i]) {//every node
                to_tp.n.clear();
                for (auto k:Node[j]->edge) {//every edge
                    if (k.v->temp == okflag) {
                        pair<char, int> pair_tp(k.c, belong[k.v->n]);
                        //to_tp.n.insert(make_pair<k.c, belong[k.v->n]>);
                        to_tp.n.insert(pair_tp);
                    }
                }
                mp[to_tp].insert(j);
            }
            //update node set
            int tp_cnt = 0;
            for (const auto &j:mp) {
                if (tp_cnt == 0) {
                    new_node_set[i].clear();
                    new_node_set[i] = j.second;
                    tp_cnt++;
                } else {
                    tot++;
                    new_node_set.push_back(j.second);
                }
            }
        }
        //update belong
        for (int i = 1; i <= tot; i++) {
            for (auto j:new_node_set[i]) {
                belong[j] = i;
            }
        }
    }

    //rebuild DFA
    new_Node.resize(tot + 1);
    for (int i = 1; i <= tot; i++) {
        new_Node[i] = new Fa_Node(i);
    }

    begin.clear();
    end.clear();

    for (int q = 1; q <= tot; q++) {
        for (auto j:new_node_set[q]) {
            int i = belong[j];
            if (Node[j]->start) {
                new_Node[i]->start = true;
                begin.push_back(new_Node[i]);
            }
            if (Node[j]->end) {
                new_Node[i]->end = true;
                end.push_back(new_Node[i]);
            }
            for (auto k:Node[j]->edge) {
                if (k.v->temp == okflag) {
                    new_Node[i]->edge.emplace_back(new_Node[belong[k.v->n]], k.c);
                }
            }
        }
    }

    //delete DFA

    for (int i = 1; i <= n; i++) {
        delete Node[i];
    }

    //update DFA
    Node.clear();
    Node = new_Node;
    n = tot;

    set<Edge> edge_tp;
    //unique edges
    for (int i = 1; i <= n; i++) {
//        if (belong[i] != i) {
//            delete Node[i];
//            continue;
//        }
        edge_tp.clear();
        for (auto j:Node[i]->edge) {
            edge_tp.insert(j);
        }
        Node[i]->edge.clear();
        for (auto j:edge_tp) {
            Node[i]->edge.push_back(j);
        }
    }
}